

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructNoHandler_Test::TestBody(Engine_testConstructNoHandler_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar2;
  Message *message;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Engine e1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Engine e;
  string *in_stack_fffffffffffffe38;
  Engine *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int line;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 uVar3;
  char *in_stack_fffffffffffffe68;
  Type TVar5;
  allocator *paVar4;
  Engine *in_stack_fffffffffffffe70;
  Message *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 uVar6;
  AssertionResult local_138 [2];
  AssertionResult local_118;
  allocator local_101;
  string local_100 [32];
  Engine local_e0;
  size_type local_98;
  undefined4 local_8c;
  AssertionResult local_88;
  uint local_74;
  AssertionResult local_50;
  Engine local_40;
  
  Engine::Engine(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  TVar5 = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             (char (*) [4])CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
             &in_stack_fffffffffffffe40->prefix);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    testing::AssertionResult::failure_message((AssertionResult *)0x115074);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe70,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
    testing::Message::~Message((Message *)0x1150d1);
  }
  local_74 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11513f);
  if (local_74 == 0) {
    local_8c = 0;
    pvVar2 = Engine::GetHandlers(&local_40);
    local_98 = std::
               vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               ::size(pvVar2);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               (int *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (unsigned_long *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe70 =
           (Engine *)testing::AssertionResult::failure_message((AssertionResult *)0x11521c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe70,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
      testing::Message::~Message((Message *)0x115279);
    }
    local_74 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1152e7);
    if (local_74 == 0) {
      paVar4 = &local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"bar",paVar4);
      TVar5 = (Type)((ulong)paVar4 >> 0x20);
      Engine::Engine(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 (char (*) [4])CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                 &in_stack_fffffffffffffe40->prefix);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
      uVar3 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe70);
        in_stack_fffffffffffffe58 =
             testing::AssertionResult::failure_message((AssertionResult *)0x115450);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe70,TVar5,
                   (char *)CONCAT17(uVar3,in_stack_fffffffffffffe60),
                   (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),in_stack_fffffffffffffe50);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffeb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
        testing::Message::~Message((Message *)0x1154ad);
      }
      local_74 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x11551b);
      if (local_74 == 0) {
        uVar6 = 0;
        pvVar2 = Engine::GetHandlers(&local_e0);
        message = (Message *)
                  std::
                  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                  ::size(pvVar2);
        testing::internal::EqHelper<true>::Compare<int,unsigned_long>
                  (in_stack_fffffffffffffe58,(char *)pvVar2,
                   (int *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                   (unsigned_long *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        line = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe40 =
               (Engine *)testing::AssertionResult::failure_message((AssertionResult *)0x1155f5);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe70,TVar5,
                     (char *)CONCAT17(uVar3,in_stack_fffffffffffffe60),line,(char *)pvVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(uVar6,in_stack_fffffffffffffec0),message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x115643);
        }
        local_74 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1156a8);
        if (local_74 == 0) {
          local_74 = 0;
        }
      }
      Engine::~Engine(in_stack_fffffffffffffe40);
    }
  }
  Engine::~Engine(in_stack_fffffffffffffe40);
  return;
}

Assistant:

TEST(Engine, testConstructNoHandler) {
    Engine e("foo");
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(0, e.GetHandlers().size());
    Engine e1(std::string("bar"));
    ASSERT_EQ("bar", e1.prefix);
    ASSERT_EQ(0, e1.GetHandlers().size());
}